

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::IsMtlxFileFormat(string *name)

{
  int iVar1;
  undefined1 local_30 [8];
  string ext;
  string *name_local;
  
  ext.field_2._8_8_ = name;
  GetExtension((string *)local_30,name);
  iVar1 = ::std::__cxx11::string::compare(local_30);
  ::std::__cxx11::string::~string((string *)local_30);
  return iVar1 == 0;
}

Assistant:

bool IsMtlxFileFormat(const std::string &name) {
  std::string ext = GetExtension(name);

  return ext.compare("mtlx") == 0;
}